

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fastpfor.h
# Opt level: O1

void __thiscall
FastPForLib::FastPForImpl<8U,_unsigned_long>::__decodeArray
          (FastPForImpl<8U,_unsigned_long> *this,uint32_t *in,size_t *length,unsigned_long *out,
          size_t nvalue)

{
  byte *pbVar1;
  byte bVar2;
  byte bVar3;
  pointer pvVar4;
  unsigned_long *out_00;
  long *plVar5;
  uint32_t uVar6;
  ulong uVar7;
  uint32_t *puVar8;
  uint uVar9;
  ulong uVar10;
  long lVar11;
  uint32_t *in_00;
  undefined1 auVar12 [64];
  undefined1 auVar13 [64];
  undefined1 auVar14 [64];
  undefined1 auVar15 [64];
  const_iterator unpackpointers [65];
  undefined8 auStack_a30 [248];
  uint32_t *local_270;
  undefined8 local_238 [65];
  
  puVar8 = in + (ulong)*in + 1;
  local_270 = (uint32_t *)
              ((long)in + ((ulong)puVar8[-1] + 3 & 0xfffffffffffffffc) + 0xc + (ulong)*in * 4);
  uVar7 = *(ulong *)(local_270 + -2);
  lVar11 = 0x30;
  uVar10 = 1;
  do {
    if ((uVar7 >> (uVar10 & 0x3f) & 1) != 0) {
      uVar9 = *local_270;
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::resize
                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                 ((long)&(((this->datatobepacked).
                           super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start)->
                         super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
                         super__Vector_impl_data + lVar11),(ulong)(uVar9 + 0x1f & 0xffffffe0));
      pvVar4 = (this->datatobepacked).
               super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      out_00 = *(unsigned_long **)
                ((long)&(pvVar4->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                        _M_impl.super__Vector_impl_data + lVar11);
      local_270 = packingvector<32U>::unpackmetight<unsigned_long>
                            (local_270,out_00,
                             *(long *)((long)&(pvVar4->
                                              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                              )._M_impl.super__Vector_impl_data + lVar11 + 8) -
                             (long)out_00 >> 3,(int)uVar10 + 1);
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::resize
                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                 ((long)&(((this->datatobepacked).
                           super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start)->
                         super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
                         super__Vector_impl_data + lVar11),(ulong)uVar9);
    }
    lVar11 = lVar11 + 0x18;
    uVar10 = uVar10 + 1;
  } while (uVar10 != 0x40);
  *length = (long)local_270 - (long)in >> 2;
  memset(local_238,0,0x208);
  pvVar4 = (this->datatobepacked).
           super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  auVar12 = vpmovsxbq_avx512f(ZEXT816(0x807060504030201));
  lVar11 = 1;
  auVar13 = vpbroadcastq_avx512f(ZEXT816(0x18));
  auVar14 = vpbroadcastq_avx512f(ZEXT816(8));
  do {
    vpmullq_avx512dq(auVar12,auVar13);
    auVar15 = vpgatherqq_avx512f(*(undefined8 *)
                                  ((long)&(pvVar4->
                                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                          )._M_impl.super__Vector_impl_data + (long)puVar8));
    auVar15 = vmovdqu64_avx512f(auVar15);
    *(undefined1 (*) [64])(local_238 + lVar11) = auVar15;
    auVar12 = vpaddq_avx512f(auVar12,auVar14);
    lVar11 = lVar11 + 8;
  } while (lVar11 != 0x41);
  if (0xff < nvalue) {
    in_00 = in + 1;
    uVar7 = 0;
    do {
      bVar2 = (byte)*puVar8;
      uVar10 = (ulong)bVar2;
      bVar3 = *(byte *)((long)puVar8 + 1);
      uVar9 = (uint)bVar3;
      lVar11 = 0;
      do {
        fastunpack(in_00,(uint64_t *)((long)out + lVar11),(uint)bVar2);
        lVar11 = lVar11 + 0x100;
        in_00 = (uint32_t *)((long)in_00 + (ulong)((uint)bVar2 * 4));
      } while (lVar11 != 0x800);
      if (bVar3 == 0) {
        puVar8 = (uint32_t *)((long)puVar8 + 2);
      }
      else {
        pbVar1 = (byte *)((long)puVar8 + 2);
        puVar8 = (uint32_t *)((long)puVar8 + 3);
        lVar11 = *pbVar1 - uVar10;
        if ((int)lVar11 == 1) {
          do {
            uVar6 = *puVar8;
            puVar8 = (uint32_t *)((long)puVar8 + 1);
            out[(byte)uVar6] = out[(byte)uVar6] | 1L << (uVar10 & 0x3f);
            uVar9 = uVar9 - 1;
          } while (uVar9 != 0);
        }
        else {
          plVar5 = (long *)local_238[lVar11];
          do {
            uVar6 = *puVar8;
            puVar8 = (uint32_t *)((long)puVar8 + 1);
            local_238[lVar11] = plVar5 + 1;
            out[(byte)uVar6] = out[(byte)uVar6] | *plVar5 << (uVar10 & 0x3f);
            uVar9 = uVar9 - 1;
            plVar5 = plVar5 + 1;
          } while (uVar9 != 0);
        }
      }
      uVar7 = (ulong)((int)uVar7 + 1);
      out = out + 0x100;
    } while (uVar7 < nvalue >> 8);
  }
  return;
}

Assistant:

void __decodeArray(const uint32_t *in, size_t &length, IntType *out,
                     const size_t nvalue) {
    const uint32_t *const initin = in;
    const uint32_t *const headerin = in++;
    const uint32_t wheremeta = headerin[0];
    const uint32_t *inexcept = headerin + wheremeta;
    const uint32_t bytesize = *inexcept++;
    const uint8_t *bytep = reinterpret_cast<const uint8_t *>(inexcept);
    inexcept += (bytesize + sizeof(uint32_t) - 1) / sizeof(uint32_t);
    IntType bitmap = *(reinterpret_cast<const IntType *>(inexcept));
    inexcept += (sizeof(IntType) + sizeof(uint32_t) - 1) / sizeof(uint32_t);
    for (uint32_t k = 2; k <= sizeof(IntType) * 8; ++k) {
      if ((bitmap & (1ULL << (k - 1))) != 0) {
        uint32_t tnvalue = *inexcept;
        datatobepacked[k].resize((tnvalue + PACKSIZE - 1) / PACKSIZE * PACKSIZE);
        inexcept = packingvector<32>::unpackmetight(
            inexcept, datatobepacked[k].data(), datatobepacked[k].size(), k);
        datatobepacked[k].resize(tnvalue);
      }
    }
    length = inexcept - initin;
    typename std::vector<IntType>::const_iterator
        unpackpointers[sizeof(IntType) * 8 + 1];
    for (uint32_t k = 1; k <= sizeof(IntType) * 8; ++k) {
      unpackpointers[k] = datatobepacked[k].begin();
    }
    for (uint32_t run = 0; run < nvalue / BlockSize; ++run, out += BlockSize) {
      const uint8_t b = *bytep++;
      const uint8_t cexcept = *bytep++;
      in = unpackblock<BlockSize>(in, out, b);
      if (cexcept > 0) {
        const uint8_t maxbits = *bytep++;
        if (maxbits - b == 1) {
          for (uint32_t k = 0; k < cexcept; ++k) {
            const uint8_t pos = *(bytep++);
            out[pos] |= static_cast<uint64_t>(1) << b;
          }
        } else {
          typename std::vector<IntType>::const_iterator &exceptionsptr =
              unpackpointers[maxbits - b];
          for (uint32_t k = 0; k < cexcept; ++k) {
            const uint8_t pos = *(bytep++);
            out[pos] |= (static_cast<uint64_t>(*(exceptionsptr++))) << b;
          }
        }
      }
    }
    assert(in == headerin + wheremeta);
  }